

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFileComparator.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::TextFileComparator::contentsAreEquivalent
          (TextFileComparator *this,string *receivedPath,string *approvedPath)

{
  int_type iVar1;
  int_type iVar2;
  bool bVar3;
  ifstream rstream;
  int aiStack_408 [122];
  ifstream astream;
  int aiStack_200 [122];
  
  ::std::ifstream::ifstream(&astream,(approvedPath->_M_dataplus)._M_p,_S_in|_S_bin);
  ::std::ifstream::ifstream(&rstream,(receivedPath->_M_dataplus)._M_p,_S_in|_S_bin);
  do {
    bVar3 = true;
    if ((*(int *)((long)aiStack_200 + *(long *)(_astream + -0x18)) != 0) ||
       (*(int *)((long)aiStack_408 + *(long *)(_rstream + -0x18)) != 0)) goto LAB_00128199;
    iVar1 = getNextRelevantCharacter(&astream);
    iVar2 = getNextRelevantCharacter(&rstream);
  } while (iVar1 == iVar2);
  bVar3 = false;
LAB_00128199:
  ::std::ifstream::~ifstream(&rstream);
  ::std::ifstream::~ifstream(&astream);
  return bVar3;
}

Assistant:

bool TextFileComparator::contentsAreEquivalent(std::string receivedPath,
                                                   std::string approvedPath) const
    {
        std::ifstream astream(approvedPath.c_str(), std::ios::binary | std::ifstream::in);
        std::ifstream rstream(receivedPath.c_str(), std::ios::binary | std::ifstream::in);

        while (astream.good() && rstream.good())
        {
            int a = getNextRelevantCharacter(astream);
            int r = getNextRelevantCharacter(rstream);

            if (a != r)
            {
                return false;
            }
        }
        return true;
    }